

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_block(cf_poly1305 *ctx,uint32_t *c)

{
  uint32_t *c_local;
  cf_poly1305 *ctx_local;
  
  poly1305_add(ctx->h,c);
  poly1305_mul(ctx->h,ctx->r);
  return;
}

Assistant:

static void poly1305_block(cf_poly1305 *ctx,
                           const uint32_t c[17])
{
  poly1305_add(ctx->h, c);
  poly1305_mul(ctx->h, ctx->r);
}